

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::render_debugger_node(Mesh *this)

{
  bool bVar1;
  VertexIter label;
  VertexIter p_data;
  HalfedgeMesh *in_RDI;
  VertexIter v;
  _Self in_stack_ffffffffffffffe0;
  float v_speed;
  
  bVar1 = ImGui::TreeNode(in_RDI,"Mesh 0x%x");
  if (bVar1) {
    bVar1 = ImGui::TreeNode(in_RDI,"Vertices");
    if (bVar1) {
      label = HalfedgeMesh::verticesBegin(in_RDI);
      while( true ) {
        v_speed = (float)((ulong)in_stack_ffffffffffffffe0._M_node >> 0x20);
        p_data = HalfedgeMesh::verticesEnd(in_RDI);
        bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,(_Self *)&stack0xffffffffffffffe8)
        ;
        if (!bVar1) break;
        std::_List_iterator<CGL::Vertex>::operator->((_List_iterator<CGL::Vertex> *)0x13011d);
        DragDouble3((char *)label._M_node,(double *)p_data._M_node,v_speed);
        in_stack_ffffffffffffffe0 =
             std::_List_iterator<CGL::Vertex>::operator++
                       ((_List_iterator<CGL::Vertex> *)&stack0xfffffffffffffff0,0);
      }
      ImGui::TreePop();
    }
    if (in_RDI[2].faces.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(in_RDI[2].faces.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl.
                 _M_node.super__List_node_base._M_next)->_M_next[2]._M_next)();
    }
    ImGui::TreePop();
  }
  return;
}

Assistant:

void Mesh::render_debugger_node()
{
  if (ImGui::TreeNode(this, "Mesh 0x%x", this))
  {
    if (ImGui::TreeNode(this, "Vertices"))
    {
      for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
        DragDouble3("Vertex", &v->position.x, 0.005);
      }
      ImGui::TreePop();
    }

    if (bsdf) bsdf->render_debugger_node();

    ImGui::TreePop();
  }
}